

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000017b5f0 = 0x2d2d2d2d2d2d2d;
    uRam000000000017b5f7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0017b5e0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000017b5e8 = 0x2d2d2d2d2d2d2d;
    DAT_0017b5ef = 0x2d;
    _DAT_0017b5d0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000017b5d8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0017b5c0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000017b5c8 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam000000000017b5b8 = 0x2d2d2d2d2d2d2d2d;
    DAT_0017b5ff = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }